

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process_line.h
# Opt level: O0

void charls::transform_line_to_triplet<charls::transform_hp1<unsigned_char>::inverse,unsigned_char>
               (uchar *source,size_t pixel_stride_in,triplet<unsigned_char> *destination,
               size_t pixel_stride,inverse *transform)

{
  ulong uVar1;
  size_t sVar2;
  triplet<unsigned_char> tVar3;
  unsigned_long *puVar4;
  undefined2 *puVar5;
  ulong local_48;
  size_t i;
  triplet<unsigned_char> *type_buffer;
  unsigned_long pixel_count;
  inverse *transform_local;
  size_t pixel_stride_local;
  triplet<unsigned_char> *destination_local;
  size_t pixel_stride_in_local;
  uchar *source_local;
  
  transform_local = (inverse *)pixel_stride;
  pixel_stride_local = (size_t)destination;
  destination_local = (triplet<unsigned_char> *)pixel_stride_in;
  pixel_stride_in_local = (size_t)source;
  puVar4 = std::min<unsigned_long>
                     ((unsigned_long *)&transform_local,(unsigned_long *)&destination_local);
  sVar2 = pixel_stride_local;
  uVar1 = *puVar4;
  for (local_48 = 0; local_48 < uVar1; local_48 = local_48 + 1) {
    tVar3 = transform_hp1<unsigned_char>::inverse::operator()
                      (transform,(uint)*(byte *)(pixel_stride_in_local + local_48),
                       (uint)(&destination_local->field_0)[pixel_stride_in_local + local_48].v1,
                       (uint)*(byte *)(pixel_stride_in_local +
                                      local_48 + (long)destination_local * 2));
    puVar5 = (undefined2 *)(sVar2 + local_48 * 3);
    *puVar5 = tVar3._0_2_;
    ((anon_union_1_2_7f9ecb7a_for_triplet<unsigned_char>_5 *)(puVar5 + 1))->v3 =
         (uchar)tVar3.field_2;
  }
  return;
}

Assistant:

void transform_line_to_triplet(const PixelType* source, const size_t pixel_stride_in, triplet<PixelType>* destination,
                               const size_t pixel_stride, Transform& transform) noexcept
{
    const auto pixel_count{std::min(pixel_stride, pixel_stride_in)};
    triplet<PixelType>* type_buffer = destination;

    for (size_t i{}; i < pixel_count; ++i)
    {
        type_buffer[i] = transform(source[i], source[i + pixel_stride_in], source[i + 2 * pixel_stride_in]);
    }
}